

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O0

QMimeData * __thiscall QListWidget::mimeData(QListWidget *this,QList<QListWidgetItem_*> *items)

{
  bool bVar1;
  QListModel *pQVar2;
  const_iterator o;
  QList<QListWidgetItem_*> *in_RSI;
  QListWidget *in_RDI;
  long in_FS_OFFSET;
  QMimeData *result;
  QListWidgetItem *item;
  QList<QListWidgetItem_*> *__range2;
  QModelIndexList *cachedIndexes;
  QListWidgetPrivate *d;
  const_iterator __end2;
  const_iterator __begin2;
  rvalue_ref in_stack_ffffffffffffff68;
  QModelIndexList *in_stack_ffffffffffffff70;
  QListWidgetItem *item_00;
  QList<QModelIndex> *in_stack_ffffffffffffff98;
  QMimeData *local_40;
  qsizetype in_stack_ffffffffffffffd8;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QListWidget *)0x89ed95);
  pQVar2 = QListWidgetPrivate::listModel((QListWidgetPrivate *)0x89edb3);
  bVar1 = QList<QModelIndex>::isEmpty((QList<QModelIndex> *)0x89edc6);
  if (bVar1) {
    item_00 = (QListWidgetItem *)&pQVar2->cachedIndexes;
    QList<QListWidgetItem_*>::size(in_RSI);
    QList<QModelIndex>::reserve(in_stack_ffffffffffffff98,in_stack_ffffffffffffffd8);
    local_10.i = (QListWidgetItem **)&DAT_aaaaaaaaaaaaaaaa;
    local_10 = QList<QListWidgetItem_*>::begin
                         ((QList<QListWidgetItem_*> *)in_stack_ffffffffffffff70);
    o = QList<QListWidgetItem_*>::end((QList<QListWidgetItem_*> *)in_stack_ffffffffffffff70);
    while( true ) {
      bVar1 = QList<QListWidgetItem_*>::const_iterator::operator!=(&local_10,o);
      if (!bVar1) break;
      QList<QListWidgetItem_*>::const_iterator::operator*(&local_10);
      in_stack_ffffffffffffff70 = &pQVar2->cachedIndexes;
      indexFromItem(in_RDI,item_00);
      QList<QModelIndex>::operator<<(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      QList<QListWidgetItem_*>::const_iterator::operator++(&local_10);
    }
    QListWidgetPrivate::listModel((QListWidgetPrivate *)0x89eecb);
    local_40 = QListModel::internalMimeData((QListModel *)0x89eed3);
    QList<QModelIndex>::clear(in_stack_ffffffffffffff70);
  }
  else {
    QListWidgetPrivate::listModel((QListWidgetPrivate *)0x89eef8);
    local_40 = QListModel::internalMimeData((QListModel *)0x89ef00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_40;
  }
  __stack_chk_fail();
}

Assistant:

QMimeData *QListWidget::mimeData(const QList<QListWidgetItem *> &items) const
{
    Q_D(const QListWidget);

    QModelIndexList &cachedIndexes = d->listModel()->cachedIndexes;

    // if non empty, it's called from the model's own mimeData
    if (cachedIndexes.isEmpty()) {
        cachedIndexes.reserve(items.size());
        for (QListWidgetItem *item : items)
            cachedIndexes << indexFromItem(item);

        QMimeData *result = d->listModel()->internalMimeData();

        cachedIndexes.clear();
        return result;
    }

    return d->listModel()->internalMimeData();
}